

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinHeap.h
# Opt level: O3

void __thiscall
sznet::MinHeap<sznet::Timer>::shiftUp_(MinHeap<sznet::Timer> *this,uint32_t hole_index,Timer *e)

{
  uint uVar1;
  int iVar2;
  Timer **ppTVar3;
  ulong uVar4;
  uint uVar5;
  
  ppTVar3 = this->m_ptrArr;
  uVar4 = 0;
  if (hole_index != 0) {
    do {
      uVar1 = hole_index - 1;
      uVar5 = uVar1 >> 1;
      iVar2 = (*this->m_pCmpFunc)(ppTVar3[uVar5],e);
      ppTVar3 = this->m_ptrArr;
      if (iVar2 != 1) {
        uVar4 = (ulong)hole_index;
        goto LAB_00137e7b;
      }
      ppTVar3[hole_index] = ppTVar3[uVar5];
      ppTVar3 = this->m_ptrArr;
      (ppTVar3[hole_index]->super_MinHeaBaseElem).min_heap_idx = hole_index;
      hole_index = uVar5;
    } while (1 < uVar1);
    uVar4 = 0;
  }
LAB_00137e7b:
  ppTVar3[uVar4] = e;
  (this->m_ptrArr[uVar4]->super_MinHeaBaseElem).min_heap_idx = (int32_t)uVar4;
  return;
}

Assistant:

void shiftUp_(uint32_t hole_index, T* e)
	{
		uint32_t parent_index = parent(hole_index);
		// 循环向上给e找个适合的位置
		while ((hole_index > 0) && m_pCmpFunc(m_ptrArr[parent_index], e) == 1)
		{
			m_ptrArr[hole_index] = m_ptrArr[parent_index];
			m_ptrArr[hole_index]->min_heap_idx = hole_index;
			hole_index = parent_index;
			parent_index = parent(hole_index);
		}
		m_ptrArr[hole_index] = e;
		m_ptrArr[hole_index]->min_heap_idx = hole_index;
	}